

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_lookup.cc
# Opt level: O3

time_zone absl::time_internal::cctz::fixed_time_zone(seconds *offset)

{
  seconds *in_RDX;
  time_zone tz;
  time_zone local_38;
  string local_30;
  
  local_38.impl_ = (Impl *)0x0;
  FixedOffsetToName_abi_cxx11_(&local_30,(cctz *)offset,in_RDX);
  time_zone::Impl::LoadTimeZone(&local_30,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return (time_zone)local_38.impl_;
}

Assistant:

time_zone fixed_time_zone(const seconds& offset) {
  time_zone tz;
  load_time_zone(FixedOffsetToName(offset), &tz);
  return tz;
}